

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O3

int __thiscall NetworkAddress::serialise(NetworkAddress *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  
  iVar1 = -0x1f;
  if (1 < max_len) {
    *buf = (char)(this->super_BER_CONTAINER)._type;
    buf[1] = '\x04';
    if (5 < max_len) {
      buf[2] = (this->_value)._address.bytes[0];
      buf[3] = (this->_value)._address.bytes[1];
      buf[4] = (this->_value)._address.bytes[2];
      buf[5] = (this->_value)._address.bytes[3];
      iVar1 = 6;
    }
  }
  return iVar1;
}

Assistant:

int NetworkAddress::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, 4);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;
    
    *ptr++ = _value[0];
    *ptr++ = _value[1];
    *ptr++ = _value[2];
    *ptr++ = _value[3];

    return ptr - buf;
}